

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenshtein_distance_test.cc
# Opt level: O0

void __thiscall LDISTANCE_TEST_Find_Test::TestBody(LDISTANCE_TEST_Find_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  StrSimilar ss;
  StringList list;
  value_type *in_stack_fffffffffffffd98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffda0;
  undefined6 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdae;
  undefined1 in_stack_fffffffffffffdaf;
  char *in_stack_fffffffffffffdb0;
  allocator *this_00;
  char *in_stack_fffffffffffffdb8;
  AssertHelper local_1e8;
  Message local_1e0;
  undefined1 local_1d2;
  allocator local_1d1;
  string local_1d0 [39];
  undefined1 local_1a9;
  AssertionResult local_1a8;
  AssertHelper local_198;
  Message local_190;
  undefined1 local_182;
  allocator local_181;
  string local_180 [39];
  undefined1 local_159;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140;
  undefined1 local_132;
  allocator local_131;
  string local_130 [39];
  undefined1 local_109;
  AssertionResult local_108;
  AssertHelper local_f8;
  Message local_f0;
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  StrSimilar *in_stack_ffffffffffffff38;
  AssertionResult local_b8;
  StrSimilar local_a2;
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [64];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x13865c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"alex",&local_41);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"apple",&local_79);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"mac",&local_a1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  StrSimilar::StrSimilar(&local_a2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"alex",&local_e1);
  StrSimilar::Find(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_e2 = 1;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
             (bool *)CONCAT17(in_stack_fffffffffffffdaf,
                              CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)),
             (bool *)in_stack_fffffffffffffda0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1389c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/levenshtein_distance_test.cc"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::Message::~Message((Message *)0x138a25);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x138a7d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"apple",&local_131);
  local_109 = StrSimilar::Find(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                               in_stack_ffffffffffffff28);
  local_132 = 1;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
             (bool *)CONCAT17(in_stack_fffffffffffffdaf,
                              CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)),
             (bool *)in_stack_fffffffffffffda0);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x138bdb);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/levenshtein_distance_test.cc"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::Message::~Message((Message *)0x138c38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x138c90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"mac",&local_181);
  local_159 = StrSimilar::Find(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                               in_stack_ffffffffffffff28);
  local_182 = 1;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
             (bool *)CONCAT17(in_stack_fffffffffffffdaf,
                              CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)),
             (bool *)in_stack_fffffffffffffda0);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    in_stack_fffffffffffffdb8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x138dee);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/levenshtein_distance_test.cc"
               ,0x28,in_stack_fffffffffffffdb8);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    testing::Message::~Message((Message *)0x138e4b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x138ea3);
  this_00 = &local_1d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"zz",this_00);
  local_1a9 = StrSimilar::Find(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                               in_stack_ffffffffffffff28);
  local_1d2 = 0;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            (in_stack_fffffffffffffdb8,(char *)this_00,
             (bool *)CONCAT17(local_1a9,
                              CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)),
             (bool *)in_stack_fffffffffffffda0);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x139001);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/levenshtein_distance_test.cc"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::Message::~Message((Message *)0x13905e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1390b3);
  StrSimilar::~StrSimilar(&local_a2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00);
  return;
}

Assistant:

TEST(LDISTANCE_TEST, Find) {
  StringList list;
  list.push_back("alex");
  list.push_back("apple");
  list.push_back("mac");
  StrSimilar ss;
  EXPECT_EQ(ss.Find(std::string("alex"), list), true);
  EXPECT_EQ(ss.Find(std::string("apple"), list), true);
  EXPECT_EQ(ss.Find(std::string("mac"), list), true);
  EXPECT_EQ(ss.Find(std::string("zz"), list), false);
}